

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

DOMElement * __thiscall xercesc_4_0::DOMElementImpl::getNextElementSibling(DOMElementImpl *this)

{
  int iVar1;
  DOMElement *pDVar2;
  DOMElement *e;
  DOMNode *n;
  DOMElementImpl *this_local;
  
  e = (DOMElement *)getNextLogicalSibling(this,(DOMNode *)this);
  while( true ) {
    if (e == (DOMElement *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*(e->super_DOMNode)._vptr_DOMNode[4])();
    if (iVar1 == 1) break;
    if ((iVar1 == 5) &&
       (pDVar2 = getFirstElementChild(this,&e->super_DOMNode), pDVar2 != (DOMElement *)0x0)) {
      return pDVar2;
    }
    e = (DOMElement *)getNextLogicalSibling(this,&e->super_DOMNode);
  }
  return e;
}

Assistant:

DOMElement * DOMElementImpl::getNextElementSibling() const
{
    DOMNode* n = getNextLogicalSibling(this);
    while (n != NULL) {
        switch (n->getNodeType()) {
            case DOMNode::ELEMENT_NODE:
                return (DOMElement*) n;
            case DOMNode::ENTITY_REFERENCE_NODE:
                {
                    DOMElement* e = getFirstElementChild(n);
                    if (e != NULL)
                        return e;
                }
                break;
            default:
                break;
        }
        n = getNextLogicalSibling(n);
    }
    return NULL;
}